

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::GenerateMessageFile
               (FileDescriptor *file,Descriptor *message,bool is_descriptor,
               GeneratorContext *generator_context)

{
  long lVar1;
  uint is_descriptor_00;
  GeneratorContext *generator_context_00;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined1 is_descriptor_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *text;
  long lVar5;
  string metadata_filename;
  string fullname;
  Printer printer;
  string metadata_fullname;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  string local_138;
  GeneratorContext *local_118;
  Printer local_110;
  string local_70;
  string local_50;
  ZeroCopyOutputStream *output;
  
  if (*(char *)(*(long *)(message + 0x20) + 0x4b) == '\0') {
    is_descriptor_00 = (uint)is_descriptor;
    GeneratedClassFileName<google::protobuf::Descriptor>(&local_50,message,is_descriptor);
    iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_50);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
    io::Printer::Printer(&local_110,output,'^');
    io::Printer::Print<char[9],std::__cxx11::string>
              (&local_110,
               "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
               ,(char (*) [9])"filename",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file);
    FilenameToClassname(&local_138,&local_50);
    lVar3 = std::__cxx11::string::find_last_of((char *)&local_138,0x39171d,0xffffffffffffffff);
    if (lVar3 << 0x20 != -0x100000000) {
      std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_138);
      io::Printer::Print<char[5],std::__cxx11::string>
                (&local_110,"namespace ^name^;\n\n",(char (*) [5])0x3918cc,&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
    }
    text = 
    "use Google\\Protobuf\\Internal\\GPBType;\nuse Google\\Protobuf\\Internal\\RepeatedField;\nuse Google\\Protobuf\\Internal\\GPBUtil;\n\n"
    ;
    if (is_descriptor) {
      text = 
      "use Google\\Protobuf\\Internal\\GPBType;\nuse Google\\Protobuf\\Internal\\GPBWire;\nuse Google\\Protobuf\\Internal\\RepeatedField;\nuse Google\\Protobuf\\Internal\\InputStream;\nuse Google\\Protobuf\\Internal\\GPBUtil;\n\n"
      ;
    }
    io::Printer::Print<>(&local_110,text);
    GenerateMessageDocComment(&local_110,message,is_descriptor_00);
    if (lVar3 << 0x20 != -0x100000000) {
      std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_138);
      std::__cxx11::string::operator=((string *)&local_138,(string *)&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
    }
    pbVar4 = &local_138;
    io::Printer::Print<char[5],std::__cxx11::string>
              (&local_110,"class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n{\n",
               (char (*) [5])0x3918cc,pbVar4);
    io::Printer::Indent(&local_110);
    io::Printer::Indent(&local_110);
    is_descriptor_01 = SUB81(pbVar4,0);
    if (0 < *(int *)(message + 0x68)) {
      lVar5 = 0;
      lVar3 = 0;
      do {
        GenerateField((FieldDescriptor *)(*(long *)(message + 0x28) + lVar5),&local_110,
                      is_descriptor);
        is_descriptor_01 = SUB81(pbVar4,0);
        lVar3 = lVar3 + 1;
        lVar5 = lVar5 + 0x98;
      } while (lVar3 < *(int *)(message + 0x68));
    }
    local_118 = generator_context;
    if (0 < *(int *)(message + 0x6c)) {
      lVar5 = 0;
      lVar3 = 0;
      do {
        pbVar4 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (*(long *)(message + 0x30) + lVar5);
        io::Printer::Print<char[5],std::__cxx11::string>
                  (&local_110,"protected $^name^;\n",(char (*) [5])0x3918cc,pbVar4);
        is_descriptor_01 = SUB81(pbVar4,0);
        lVar3 = lVar3 + 1;
        lVar5 = lVar5 + 0x30;
      } while (lVar3 < *(int *)(message + 0x6c));
    }
    io::Printer::Print<>(&local_110,"\n");
    GenerateMessageConstructorDocComment(&local_110,message,is_descriptor_00);
    io::Printer::Print<>(&local_110,"public function __construct($data = NULL) {\n");
    io::Printer::Indent(&local_110);
    io::Printer::Indent(&local_110);
    GeneratedMetadataFileName_abi_cxx11_
              (&local_178,(php *)file,(FileDescriptor *)(ulong)is_descriptor_00,
               (bool)is_descriptor_01);
    FilenameToClassname(&local_70,&local_178);
    io::Printer::Print<char[9],std::__cxx11::string>
              (&local_110,"\\^fullname^::initOnce();\nparent::__construct($data);\n",
               (char (*) [9])"fullname",&local_70);
    io::Printer::Outdent(&local_110);
    io::Printer::Outdent(&local_110);
    io::Printer::Print<>(&local_110,"}\n\n");
    if (0 < *(int *)(message + 0x68)) {
      lVar5 = 0;
      lVar3 = 0;
      do {
        GenerateFieldAccessor
                  ((FieldDescriptor *)(*(long *)(message + 0x28) + lVar5),is_descriptor,&local_110);
        lVar3 = lVar3 + 1;
        lVar5 = lVar5 + 0x98;
      } while (lVar3 < *(int *)(message + 0x68));
    }
    if (0 < *(int *)(message + 0x6c)) {
      lVar3 = 0;
      lVar5 = 0;
      do {
        lVar1 = *(long *)(message + 0x30);
        UnderscoresToCamelCase(&local_158,*(string **)(lVar1 + lVar3),true);
        io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
                  (&local_110,
                   "/**\n * @return string\n */\npublic function get^camel_name^()\n{\n    return $this->whichOneof(\"^name^\");\n}\n\n"
                   ,(char (*) [11])"camel_name",&local_158,(char (*) [5])0x3918cc,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar1 + lVar3));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        lVar5 = lVar5 + 1;
        lVar3 = lVar3 + 0x30;
      } while (lVar5 < *(int *)(message + 0x6c));
    }
    io::Printer::Outdent(&local_110);
    generator_context_00 = local_118;
    io::Printer::Outdent(&local_110);
    io::Printer::Print<>(&local_110,"}\n\n");
    if (*(long *)(message + 0x18) != 0) {
      io::Printer::Print<>
                (&local_110,
                 "// Adding a class alias for backwards compatibility with the previous class name.\n"
                );
      LegacyFullClassName<google::protobuf::Descriptor>(&local_158,message,is_descriptor);
      io::Printer::Print<char[4],std::__cxx11::string,char[4],std::__cxx11::string>
                (&local_110,"class_alias(^new^::class, \\^old^::class);\n\n",(char (*) [4])"new",
                 &local_138,(char (*) [4])"old",&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      LegacyGenerateClassFile<google::protobuf::Descriptor>
                (file,message,is_descriptor,generator_context_00);
    }
    if (0 < *(int *)(message + 0x70)) {
      lVar3 = 0;
      lVar5 = 0;
      do {
        GenerateMessageFile(file,(Descriptor *)(*(long *)(message + 0x38) + lVar3),is_descriptor,
                            generator_context_00);
        lVar5 = lVar5 + 1;
        lVar3 = lVar3 + 0x90;
      } while (lVar5 < *(int *)(message + 0x70));
    }
    if (0 < *(int *)(message + 0x74)) {
      lVar3 = 0;
      lVar5 = 0;
      do {
        GenerateEnumFile(file,(EnumDescriptor *)(*(long *)(message + 0x40) + lVar3),is_descriptor,
                         generator_context_00);
        lVar5 = lVar5 + 1;
        lVar3 = lVar3 + 0x50;
      } while (lVar5 < *(int *)(message + 0x74));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    io::Printer::~Printer(&local_110);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])(output);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void GenerateMessageFile(const FileDescriptor* file, const Descriptor* message,
                         bool is_descriptor,
                         GeneratorContext* generator_context) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }

  std::string filename = GeneratedClassFileName(message, is_descriptor);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateUseDeclaration(is_descriptor, &printer);

  GenerateMessageDocComment(&printer, message, is_descriptor);
  if (lastindex != string::npos) {
    fullname = fullname.substr(lastindex + 1);
  }

  printer.Print(
      "class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n"
      "{\n",
      "name", fullname);
  Indent(&printer);

  // Field and oneof definitions.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateField(field, &printer, is_descriptor);
  }
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    GenerateOneofField(oneof, &printer);
  }
  printer.Print("\n");

  GenerateMessageConstructorDocComment(&printer, message, is_descriptor);
  printer.Print(
      "public function __construct($data = NULL) {\n");
  Indent(&printer);

  std::string metadata_filename =
      GeneratedMetadataFileName(file, is_descriptor);
  std::string metadata_fullname = FilenameToClassname(metadata_filename);
  printer.Print(
      "\\^fullname^::initOnce();\n"
      "parent::__construct($data);\n",
      "fullname", metadata_fullname);

  Outdent(&printer);
  printer.Print("}\n\n");

  // Field and oneof accessors.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateFieldAccessor(field, is_descriptor, &printer);
  }
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer.Print(
      "/**\n"
      " * @return string\n"
      " */\n"
      "public function get^camel_name^()\n"
      "{\n"
      "    return $this->whichOneof(\"^name^\");\n"
      "}\n\n",
      "camel_name", UnderscoresToCamelCase(oneof->name(), true), "name",
      oneof->name());
  }

  Outdent(&printer);
  printer.Print("}\n\n");

  // write legacy file for backwards compatiblity with nested messages and enums
  if (message->containing_type() != NULL) {
    printer.Print(
        "// Adding a class alias for backwards compatibility with the previous class name.\n");
    printer.Print(
        "class_alias(^new^::class, \\^old^::class);\n\n",
        "new", fullname,
        "old", LegacyFullClassName(message, is_descriptor));
    LegacyGenerateClassFile(file, message, is_descriptor, generator_context);
  }

  // Nested messages and enums.
  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageFile(file, message->nested_type(i), is_descriptor,
                        generator_context);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumFile(file, message->enum_type(i), is_descriptor,
                     generator_context);
  }
}